

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O3

ssize_t __thiscall
xmrig::DaemonClient::send(DaemonClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  HttpsClient *this_00;
  undefined4 extraout_var;
  socklen_t __len;
  IHttpListener *pIVar2;
  undefined4 in_register_00000084;
  String local_40;
  
  if (((this->super_BaseClient).m_pool.m_flags.super__Base_bitset<1UL>._M_w & 2) == 0) {
    this_00 = (HttpsClient *)operator_new(0x108);
    String::String(&local_40,(char *)__buf);
    pIVar2 = &this->super_IHttpListener;
    HttpClient::HttpClient
              ((HttpClient *)this_00,__fd,&local_40,pIVar2,(char *)__n,
               CONCAT44(in_register_00000084,__flags));
    __len = (socklen_t)pIVar2;
  }
  else {
    this_00 = (HttpsClient *)operator_new(0x988);
    String::String(&local_40,(char *)__buf);
    pIVar2 = &this->super_IHttpListener;
    HttpsClient::HttpsClient
              (this_00,__fd,&local_40,pIVar2,(char *)__n,CONCAT44(in_register_00000084,__flags),
               &(this->super_BaseClient).m_pool.m_fingerprint);
    __len = (socklen_t)pIVar2;
  }
  if (local_40.m_data != (char *)0x0) {
    operator_delete__(local_40.m_data);
  }
  (this_00->super_HttpClient).m_quiet =
       (bool)((long)(this->super_BaseClient).m_retries <= (this->super_BaseClient).m_failures |
             (this->super_BaseClient).m_quiet);
  iVar1 = HttpClient::connect(&this_00->super_HttpClient,(int)this + 0x1c0,
                              (sockaddr *)(ulong)(this->super_BaseClient).m_pool.m_url.m_port,__len)
  ;
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

void xmrig::DaemonClient::send(int method, const char *url, const char *data, size_t size)
{
    LOG_DEBUG("[%s:%d] " MAGENTA_BOLD("\"%s %s\"") BLACK_BOLD_S " send (%zu bytes): \"%.*s\"",
              m_pool.host().data(),
              m_pool.port(),
              http_method_str(static_cast<http_method>(method)),
              url,
              size,
              static_cast<int>(size),
              data);

    HttpClient *client;
#   ifdef XMRIG_FEATURE_TLS
    if (m_pool.isTLS()) {
        client = new HttpsClient(method, url, this, data, size, m_pool.fingerprint());
    }
    else
#   endif
    {
        client = new HttpClient(method, url, this, data, size);
    }

    client->setQuiet(isQuiet());
    client->connect(m_pool.host(), m_pool.port());
}